

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::setCursorVisible(QWidgetTextControlPrivate *this,bool visible)

{
  bool bVar1;
  void **ppvVar2;
  QObject *pQVar3;
  undefined4 *puVar4;
  long in_FS_OFFSET;
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->cursorVisible != visible) {
    this->cursorVisible = visible;
    updateCursorBlinking(this);
    bVar1 = this->cursorVisible;
    pQVar3 = (QObject *)QGuiApplication::styleHints();
    if (bVar1 == true) {
      local_48 = QStyleHints::cursorFlashTimeChanged;
      local_40 = 0;
      local_58 = updateCursorBlinking;
      local_50 = (ImplFn)0x0;
      ppvVar2 = *(void ***)&this->field_0x8;
      puVar4 = (undefined4 *)operator_new(0x20);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::
           QPrivateSlotObject<void_(QWidgetTextControlPrivate::*)(),_QtPrivate::List<>,_void>::impl;
      *(code **)(puVar4 + 4) = updateCursorBlinking;
      *(undefined8 *)(puVar4 + 6) = 0;
      QObject::connectImpl
                (local_60,(void **)pQVar3,(QObject *)&local_48,ppvVar2,(QSlotObjectBase *)&local_58,
                 (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_60);
    }
    else {
      local_48 = QStyleHints::cursorFlashTimeChanged;
      local_40 = 0;
      local_58 = updateCursorBlinking;
      local_50 = (ImplFn)0x0;
      QObject::disconnectImpl
                (pQVar3,&local_48,*(QObject **)&this->field_0x8,&local_58,
                 (QMetaObject *)&QStyleHints::staticMetaObject);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::setCursorVisible(bool visible)
{
    if (cursorVisible == visible)
        return;

    cursorVisible = visible;
    updateCursorBlinking();

    if (cursorVisible)
        connect(QGuiApplication::styleHints(), &QStyleHints::cursorFlashTimeChanged, this, &QWidgetTextControlPrivate::updateCursorBlinking);
    else
        disconnect(QGuiApplication::styleHints(), &QStyleHints::cursorFlashTimeChanged, this, &QWidgetTextControlPrivate::updateCursorBlinking);
}